

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTD_ldm_adjustParameters(ldmParams_t *params,ZSTD_compressionParameters *cParams)

{
  uint uVar1;
  uint uVar2;
  U32 UVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = cParams->windowLog;
  params->windowLog = uVar2;
  uVar4 = params->bucketSizeLog;
  if (uVar4 == 0) {
    params->bucketSizeLog = 3;
    uVar4 = 3;
  }
  uVar5 = params->minMatchLength;
  if (uVar5 == 0) {
    params->minMatchLength = 0x40;
    uVar5 = 0x40;
  }
  if (6 < (int)cParams->strategy) {
    if (uVar5 < cParams->targetLength) {
      uVar5 = cParams->targetLength;
    }
    if (uVar5 < 4) {
      __assert_fail("minMatch >= ZSTD_LDM_MINMATCH_MIN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4355,
                    "void ZSTD_ldm_adjustParameters(ldmParams_t *, const ZSTD_compressionParameters *)"
                   );
    }
    if (0x1000 < uVar5) {
      __assert_fail("minMatch <= ZSTD_LDM_MINMATCH_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4356,
                    "void ZSTD_ldm_adjustParameters(ldmParams_t *, const ZSTD_compressionParameters *)"
                   );
    }
    params->minMatchLength = uVar5;
  }
  uVar5 = params->hashLog;
  if (uVar5 == 0) {
    uVar1 = uVar2 - 7;
    uVar5 = 6;
    if (6 < uVar1) {
      uVar5 = uVar1;
    }
    params->hashLog = uVar5;
    if (0x1e < uVar1) {
      __assert_fail("params->hashLog <= ZSTD_HASHLOG_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x435b,
                    "void ZSTD_ldm_adjustParameters(ldmParams_t *, const ZSTD_compressionParameters *)"
                   );
    }
  }
  if (params->hashRateLog == 0) {
    UVar3 = uVar2 - uVar5;
    if (uVar2 < uVar5) {
      UVar3 = 0;
    }
    params->hashRateLog = UVar3;
  }
  if (uVar4 < uVar5) {
    uVar5 = uVar4;
  }
  params->bucketSizeLog = uVar5;
  return;
}

Assistant:

void ZSTD_ldm_adjustParameters(ldmParams_t* params,
                               ZSTD_compressionParameters const* cParams)
{
    params->windowLog = cParams->windowLog;
    ZSTD_STATIC_ASSERT(LDM_BUCKET_SIZE_LOG <= ZSTD_LDM_BUCKETSIZELOG_MAX);
    DEBUGLOG(4, "ZSTD_ldm_adjustParameters");
    if (!params->bucketSizeLog) params->bucketSizeLog = LDM_BUCKET_SIZE_LOG;
    if (!params->minMatchLength) params->minMatchLength = LDM_MIN_MATCH_LENGTH;
    if (cParams->strategy >= ZSTD_btopt) {
      /* Get out of the way of the optimal parser */
      U32 const minMatch = MAX(cParams->targetLength, params->minMatchLength);
      assert(minMatch >= ZSTD_LDM_MINMATCH_MIN);
      assert(minMatch <= ZSTD_LDM_MINMATCH_MAX);
      params->minMatchLength = minMatch;
    }
    if (params->hashLog == 0) {
        params->hashLog = MAX(ZSTD_HASHLOG_MIN, params->windowLog - LDM_HASH_RLOG);
        assert(params->hashLog <= ZSTD_HASHLOG_MAX);
    }
    if (params->hashRateLog == 0) {
        params->hashRateLog = params->windowLog < params->hashLog
                                   ? 0
                                   : params->windowLog - params->hashLog;
    }
    params->bucketSizeLog = MIN(params->bucketSizeLog, params->hashLog);
}